

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void cmCacheManager::OutputKey(ostream *fout,string *key)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  string_view str;
  
  lVar2 = std::__cxx11::string::find((char)key,0x3a);
  if (lVar2 == -1) {
    str._M_str = (key->_M_dataplus)._M_p;
    str._M_len = key->_M_string_length;
    bVar1 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0x6a2935);
    pcVar4 = "";
    if (bVar1) {
      pcVar4 = "\"";
    }
  }
  else {
    pcVar4 = "\"";
  }
  poVar3 = std::operator<<(fout,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)key);
  std::operator<<(poVar3,pcVar4);
  return;
}

Assistant:

void cmCacheManager::OutputKey(std::ostream& fout, std::string const& key)
{
  // support : in key name by double quoting
  const char* q =
    (key.find(':') != std::string::npos || cmHasLiteralPrefix(key, "//"))
    ? "\""
    : "";
  fout << q << key << q;
}